

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
vector_utils::add(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                 vector<float,_std::allocator<float>_> *a,vector<float,_std::allocator<float>_> *b)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  invalid_argument *this;
  const_reference pvVar6;
  reference pvVar7;
  int local_34;
  allocator<float> local_2e;
  undefined1 local_2d;
  int i;
  vector<float,_std::allocator<float>_> *local_20;
  vector<float,_std::allocator<float>_> *b_local;
  vector<float,_std::allocator<float>_> *a_local;
  vector<float,_std::allocator<float>_> *output;
  
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(a);
  sVar4 = std::vector<float,_std::allocator<float>_>::size(local_20);
  if (sVar3 == sVar4) {
    local_2d = 0;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(b_local);
    std::allocator<float>::allocator(&local_2e);
    std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,sVar3,&local_2e);
    std::allocator<float>::~allocator(&local_2e);
    for (local_34 = 0; sVar3 = std::vector<float,_std::allocator<float>_>::size(b_local),
        (ulong)(long)local_34 < sVar3; local_34 = local_34 + 1) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](b_local,(long)local_34);
      fVar1 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_20,(long)local_34);
      fVar2 = *pvVar6;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         (__return_storage_ptr__,(long)local_34);
      *pvVar7 = fVar1 + fVar2;
    }
    return __return_storage_ptr__;
  }
  poVar5 = log_error();
  poVar5 = std::operator<<(poVar5,"[Nelder-Mead] Add operands dimmensions do not match. ");
  poVar5 = std::operator<<(poVar5,"dim(a)=");
  sVar3 = std::vector<float,_std::allocator<float>_>::size(b_local);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
  poVar5 = std::operator<<(poVar5,"; dim(b)=");
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_20);
  std::ostream::operator<<(poVar5,sVar3);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Operands dimmensions do not match");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<float> vector_utils::add(const std::vector<float> &a, const std::vector<float> &b)
{
  if (a.size() != b.size())
  {
    log_error() << "[Nelder-Mead] Add operands dimmensions do not match. "
      << "dim(a)=" << a.size() << "; dim(b)=" << b.size();
    throw std::invalid_argument("Operands dimmensions do not match");
  }

  std::vector<float> output(a.size());

  for (auto i = 0; i < a.size(); ++i)
  {
    output[i] = a[i] + b[i];
  }

  return output;
}